

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsscene.cpp
# Opt level: O0

void __thiscall
QGraphicsScenePrivate::registerTopLevelItem(QGraphicsScenePrivate *this,QGraphicsItem *item)

{
  qsizetype qVar1;
  QGraphicsItemPrivate *pQVar2;
  long in_RSI;
  long in_RDI;
  QGraphicsScenePrivate *unaff_retaddr;
  parameter_type in_stack_ffffffffffffffd8;
  
  ensureSequentialTopLevelSiblingIndexes(unaff_retaddr);
  *(uint *)(in_RDI + 0xb8) = *(uint *)(in_RDI + 0xb8) & 0xffffffdf | 0x20;
  qVar1 = QList<QGraphicsItem_*>::size((QList<QGraphicsItem_*> *)(in_RDI + 0x148));
  pQVar2 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::
           operator->((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                       *)(in_RSI + 8));
  pQVar2->siblingIndex = (int)qVar1;
  QList<QGraphicsItem_*>::append((QList<QGraphicsItem_*> *)0x9c1006,in_stack_ffffffffffffffd8);
  return;
}

Assistant:

void QGraphicsScenePrivate::registerTopLevelItem(QGraphicsItem *item)
{
    ensureSequentialTopLevelSiblingIndexes();
    needSortTopLevelItems = true; // ### maybe false
    item->d_ptr->siblingIndex = topLevelItems.size();
    topLevelItems.append(item);
}